

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O1

bool __thiscall
cmCTest::RunMakeCommand
          (cmCTest *this,string *command,string *output,int *retVal,char *dir,cmDuration timeout,
          ostream *ofs,Encoding encoding)

{
  void *pvVar1;
  undefined8 uVar2;
  string *psVar3;
  StdioType *pSVar4;
  char *__s;
  bool bVar5;
  int fd;
  ostream *poVar6;
  cmUVProcessChainBuilder *this_00;
  size_t sVar7;
  uv_loop_t *ctx;
  uv_pipe_s *handle;
  uv_stream_t *stream;
  cmUVStreamReadHandle *pcVar8;
  undefined8 *puVar9;
  ulong uVar10;
  Status *this_01;
  long *plVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  pointer pbVar12;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  cmProcessOutput processOutput;
  unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_> outputHandle;
  cmUVProcessChain chain;
  _Any_data __tmp;
  uv_pipe_ptr outputStream;
  size_type tick_len;
  cmUVProcessChainBuilder builder;
  size_type tick_line_len;
  size_type tick;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  ostringstream cmCTestLog_msg;
  cmProcessOutput local_319;
  cmUVStreamReadHandle *local_318;
  undefined1 local_310 [12];
  int iStack_304;
  StdioType SStack_300;
  int iStack_2fc;
  pointer local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0;
  char *local_2d8;
  char local_2c8 [16];
  uv_handle_ptr_base_<uv_pipe_s> local_2b8;
  string *local_2a8;
  ostream *local_2a0;
  undefined8 local_298;
  cmUVProcessChainBuilder local_290;
  StdioType *local_230;
  pointer local_228;
  pointer local_220;
  char *local_218;
  undefined8 local_210;
  undefined8 local_208;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_200;
  _Any_data local_1e8;
  _Manager_type local_1d8;
  _Invoker_type p_Stack_1d0;
  ios_base local_178 [272];
  string local_68;
  undefined1 local_48 [16];
  
  local_48._8_4_ = in_XMM0_Dc;
  local_48._0_8_ = timeout.__r;
  local_48._12_4_ = in_XMM0_Dd;
  local_2a0 = ofs;
  cmSystemTools::ParseArguments(&local_200,command);
  if (local_200.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_200.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_228 = local_200.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    local_220 = local_200.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    output->_M_string_length = 0;
    *(output->_M_dataplus)._M_p = '\0';
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8._M_pod_data);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,"Run command:",0xc);
    std::__cxx11::stringbuf::str();
    Log(this,5,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
        ,0x444,(char *)local_290.Stdio._M_elems[0],false);
    local_2a8 = output;
    local_230 = (StdioType *)retVal;
    local_218 = dir;
    if (local_290.Stdio._M_elems[0] != (StdioConfiguration)(local_290.Stdio._M_elems + 2)) {
      operator_delete((void *)local_290.Stdio._M_elems[0],(long)local_290.Stdio._M_elems[2] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8._M_pod_data);
    std::ios_base::~ios_base(local_178);
    if (local_200.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_200.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar12 = local_200.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8._M_pod_data);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8," \"",2);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_1e8,(pbVar12->_M_dataplus)._M_p,
                            pbVar12->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"",1);
        std::__cxx11::stringbuf::str();
        Log(this,5,
            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
            ,0x446,(char *)local_290.Stdio._M_elems[0],false);
        if (local_290.Stdio._M_elems[0] != (StdioConfiguration)(local_290.Stdio._M_elems + 2)) {
          operator_delete((void *)local_290.Stdio._M_elems[0],(long)local_290.Stdio._M_elems[2] + 1)
          ;
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8._M_pod_data);
        std::ios_base::~ios_base(local_178);
        pbVar12 = pbVar12 + 1;
      } while (pbVar12 !=
               local_200.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8._M_pod_data);
    std::ios::widen((char)&local_1e8 +
                    (char)*(undefined8 *)(local_1e8._M_unused._M_member_pointer - 0x18));
    __s = local_218;
    std::ostream::put((char)&local_1e8);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(this,5,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
        ,0x448,(char *)local_290.Stdio._M_elems[0],false);
    if (local_290.Stdio._M_elems[0] != (StdioConfiguration)(local_290.Stdio._M_elems + 2)) {
      operator_delete((void *)local_290.Stdio._M_elems[0],(long)local_290.Stdio._M_elems[2] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8._M_pod_data);
    std::ios_base::~ios_base(local_178);
    cmUVProcessChainBuilder::cmUVProcessChainBuilder(&local_290);
    this_00 = cmUVProcessChainBuilder::AddCommand(&local_290,&local_200);
    cmUVProcessChainBuilder::SetMergedBuiltinStreams(this_00);
    if (__s != (char *)0x0) {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      sVar7 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,__s,__s + sVar7);
      cmUVProcessChainBuilder::SetWorkingDirectory(&local_290,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
    cmUVProcessChainBuilder::Start((cmUVProcessChainBuilder *)local_310);
    local_2b8.handle.super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_2b8.handle.super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ctx = cmUVProcessChain::GetLoop((cmUVProcessChain *)local_310);
    ::cm::uv_pipe_ptr::init((uv_pipe_ptr *)&local_2b8,(EVP_PKEY_CTX *)ctx);
    handle = ::cm::uv_handle_ptr_::operator_cast_to_uv_pipe_s_
                       ((uv_handle_ptr_<uv_pipe_s> *)&local_2b8);
    fd = cmUVProcessChain::OutputStream((cmUVProcessChain *)local_310);
    uv_pipe_open(handle,fd);
    local_208 = 0;
    local_298 = 0x400;
    local_210 = 0x32;
    cmProcessOutput::cmProcessOutput(&local_319,encoding,0x400);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8._M_pod_data);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1e8,"   Each . represents ",0x15);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1e8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," bytes of output\n    ",0x15);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(this,3,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
        ,0x45f,(char *)CONCAT44(iStack_304,local_310._8_4_),false);
    if ((pointer *)CONCAT44(iStack_304,local_310._8_4_) != &local_2f8) {
      operator_delete((pointer *)CONCAT44(iStack_304,local_310._8_4_),
                      (ulong)((long)&(local_2f8->Arguments).
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8._M_pod_data);
    std::ios_base::~ios_base(local_178);
    stream = ::cm::uv_pipe_ptr::operator_cast_to_uv_stream_s_((uv_pipe_ptr *)&local_2b8);
    pcVar8 = (cmUVStreamReadHandle *)operator_new(0x58);
    *(undefined8 *)((long)&(pcVar8->OnFinish).super__Function_base._M_functor + 8) = 0;
    (pcVar8->OnFinish).super__Function_base._M_manager = (_Manager_type)0x0;
    (pcVar8->OnRead)._M_invoker = (_Invoker_type)0x0;
    *(undefined8 *)&(pcVar8->OnFinish).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(pcVar8->OnRead).super__Function_base._M_functor + 8) = 0;
    (pcVar8->OnRead).super__Function_base._M_manager = (_Manager_type)0x0;
    (pcVar8->Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)0x0;
    *(undefined8 *)&(pcVar8->OnRead).super__Function_base._M_functor = 0;
    (pcVar8->Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    (pcVar8->Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x0;
    (pcVar8->OnFinish)._M_invoker = (_Invoker_type)0x0;
    local_1d8 = (_Manager_type)0x0;
    p_Stack_1d0 = (_Invoker_type)0x0;
    local_1e8._M_unused._M_object = (void *)0x0;
    local_1e8._8_8_ = 0;
    local_318 = pcVar8;
    puVar9 = (undefined8 *)operator_new(0x38);
    *puVar9 = this;
    puVar9[1] = &local_319;
    puVar9[2] = local_2a8;
    puVar9[3] = &local_208;
    puVar9[4] = &local_298;
    puVar9[5] = &local_210;
    puVar9[6] = local_2a0;
    local_1e8._0_4_ = SUB84(puVar9,0);
    local_1e8._4_4_ = (undefined4)((ulong)puVar9 >> 0x20);
    local_310._8_4_ = local_1e8._0_4_;
    iStack_304 = local_1e8._4_4_;
    SStack_300 = local_1e8._8_4_;
    iStack_2fc = local_1e8._12_4_;
    pvVar1 = *(void **)&(pcVar8->OnRead).super__Function_base._M_functor;
    uVar2 = *(undefined8 *)((long)&(pcVar8->OnRead).super__Function_base._M_functor + 8);
    *(undefined4 *)&(pcVar8->OnRead).super__Function_base._M_functor = local_1e8._0_4_;
    *(undefined4 *)((long)&(pcVar8->OnRead).super__Function_base._M_functor + 4) = local_1e8._4_4_;
    *(undefined4 *)((long)&(pcVar8->OnRead).super__Function_base._M_functor + 8) = local_1e8._8_4_;
    *(undefined4 *)((long)&(pcVar8->OnRead).super__Function_base._M_functor + 0xc) =
         local_1e8._12_4_;
    local_1d8 = (pcVar8->OnRead).super__Function_base._M_manager;
    (pcVar8->OnRead).super__Function_base._M_manager =
         std::
         _Function_handler<void_(std::vector<char,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx:1122:5)>
         ::_M_manager;
    p_Stack_1d0 = (pcVar8->OnRead)._M_invoker;
    (pcVar8->OnRead)._M_invoker =
         std::
         _Function_handler<void_(std::vector<char,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx:1122:5)>
         ::_M_invoke;
    if (local_1d8 != (_Manager_type)0x0) {
      local_1e8._M_unused._M_object = pvVar1;
      local_1e8._8_8_ = uVar2;
      (*local_1d8)(&local_1e8,&local_1e8,__destroy_functor);
    }
    local_1d8 = (_Manager_type)0x0;
    p_Stack_1d0 = (_Invoker_type)0x0;
    local_1e8._M_unused._M_object = (void *)0x0;
    local_1e8._8_8_ = 0;
    puVar9 = (undefined8 *)operator_new(0x20);
    psVar3 = local_2a8;
    *puVar9 = this;
    puVar9[1] = &local_319;
    puVar9[2] = local_2a8;
    puVar9[3] = local_2a0;
    local_1e8._0_4_ = SUB84(puVar9,0);
    local_1e8._4_4_ = (undefined4)((ulong)puVar9 >> 0x20);
    local_310._8_4_ = local_1e8._0_4_;
    iStack_304 = local_1e8._4_4_;
    SStack_300 = local_1e8._8_4_;
    iStack_2fc = local_1e8._12_4_;
    pvVar1 = *(void **)&(pcVar8->OnFinish).super__Function_base._M_functor;
    uVar2 = *(undefined8 *)((long)&(pcVar8->OnFinish).super__Function_base._M_functor + 8);
    *(undefined4 *)&(pcVar8->OnFinish).super__Function_base._M_functor = local_1e8._0_4_;
    *(undefined4 *)((long)&(pcVar8->OnFinish).super__Function_base._M_functor + 4) = local_1e8._4_4_
    ;
    *(undefined4 *)((long)&(pcVar8->OnFinish).super__Function_base._M_functor + 8) = local_1e8._8_4_
    ;
    *(undefined4 *)((long)&(pcVar8->OnFinish).super__Function_base._M_functor + 0xc) =
         local_1e8._12_4_;
    local_1d8 = (pcVar8->OnFinish).super__Function_base._M_manager;
    (pcVar8->OnFinish).super__Function_base._M_manager =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx:1147:5)>
         ::_M_manager;
    p_Stack_1d0 = (_Invoker_type)(pcVar8->OnFinish)._M_invoker;
    (pcVar8->OnFinish)._M_invoker =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx:1147:5)>
         ::_M_invoke;
    local_1e8._M_unused._M_object = pvVar1;
    local_1e8._8_8_ = uVar2;
    if (local_1d8 != (_Manager_type)0x0) {
      (*local_1d8)(&local_1e8,&local_1e8,__destroy_functor);
    }
    stream->data = pcVar8;
    uv_read_start(stream,cmUVStreamRead<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx:1122:5),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx:1147:5)>
                         ::anon_class_1_0_00000001::__invoke,
                  cmUVStreamRead<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx:1122:5),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx:1147:5)>
                  ::anon_class_1_0_00000001::__invoke);
    uVar10 = (ulong)((double)local_48._0_8_ * 1000.0);
    bVar5 = cmUVProcessChain::Wait
                      ((cmUVProcessChain *)local_310,
                       (long)((double)local_48._0_8_ * 1000.0 - 9.223372036854776e+18) &
                       (long)uVar10 >> 0x3f | uVar10);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8._M_pod_data);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1e8," Size of output: ",0x11);
    poVar6 = (ostream *)
             std::ostream::operator<<
                       (&local_1e8,
                        (int)((((double)CONCAT44(0x45300000,(int)(psVar3->_M_string_length >> 0x20))
                               - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)psVar3->_M_string_length) -
                              4503599627370496.0)) * 0.0009765625));
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"K",1);
    std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(this,3,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
        ,0x48b,(char *)CONCAT44(iStack_304,local_310._8_4_),false);
    if ((pointer *)CONCAT44(iStack_304,local_310._8_4_) != &local_2f8) {
      operator_delete((pointer *)CONCAT44(iStack_304,local_310._8_4_),
                      (ulong)((long)&(local_2f8->Arguments).
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8._M_pod_data);
    std::ios_base::~ios_base(local_178);
    if (bVar5) {
      this_01 = cmUVProcessChain::GetStatus((cmUVProcessChain *)local_310,0);
      cmUVProcessChain::Status::GetException_abi_cxx11_
                ((pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_310 + 8),this_01);
      pSVar4 = local_230;
      if (local_310._8_4_ == None) {
        *local_230 = (StdioType)this_01->ExitStatus;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8._M_pod_data);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,"Command exited with the value: ",0x1f);
        plVar11 = (long *)std::ostream::operator<<(&local_1e8,*pSVar4);
        std::ios::widen((char)*(undefined8 *)(*plVar11 + -0x18) + (char)plVar11);
        std::ostream::put((char)plVar11);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        Log(this,5,
            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
            ,0x494,local_2d8,false);
      }
      else if (local_310._8_4_ == 5) {
        std::__cxx11::string::append((char *)psVar3);
        std::__cxx11::string::_M_append((char *)psVar3,CONCAT44(iStack_2fc,SStack_300));
        std::__cxx11::string::append((char *)psVar3);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8._M_pod_data);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,"There was an error: ",0x14);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_1e8,(char *)CONCAT44(iStack_2fc,SStack_300),
                            (long)local_2f8);
        std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        Log(this,7,
            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
            ,0x49b,local_2d8,false);
      }
      else {
        *local_230 = local_310._8_4_;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8._M_pod_data);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e8,"There was an exception: ",0x18);
        plVar11 = (long *)std::ostream::operator<<(&local_1e8,*pSVar4);
        std::ios::widen((char)*(undefined8 *)(*plVar11 + -0x18) + (char)plVar11);
        std::ostream::put((char)plVar11);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        Log(this,6,
            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
            ,0x4a0,local_2d8,false);
      }
      if (local_2d8 != local_2c8) {
        operator_delete(local_2d8,local_2c8._0_8_ + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8._M_pod_data);
      std::ios_base::~ios_base(local_178);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(iStack_2fc,SStack_300) != &local_2f0) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(iStack_2fc,SStack_300),
                        (ulong)(local_2f0._M_allocated_capacity + 1));
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8._M_pod_data);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1e8,"There was a timeout",0x13);
      std::ios::widen((char)&local_1e8 +
                      (char)*(undefined8 *)(local_1e8._M_unused._M_member_pointer - 0x18));
      std::ostream::put((char)&local_1e8);
      std::ostream::flush();
      std::__cxx11::stringbuf::str();
      Log(this,6,
          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
          ,0x4a4,(char *)CONCAT44(iStack_304,local_310._8_4_),false);
      if ((pointer *)CONCAT44(iStack_304,local_310._8_4_) != &local_2f8) {
        operator_delete((pointer *)CONCAT44(iStack_304,local_310._8_4_),
                        (ulong)((long)&(local_2f8->Arguments).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8._M_pod_data);
      std::ios_base::~ios_base(local_178);
    }
    if (local_318 != (cmUVStreamReadHandle *)0x0) {
      std::default_delete<cmUVStreamReadHandle>::operator()
                ((default_delete<cmUVStreamReadHandle> *)&local_318,local_318);
    }
    ::cm::uv_handle_ptr_base_<uv_pipe_s>::~uv_handle_ptr_base_(&local_2b8);
    cmUVProcessChain::~cmUVProcessChain((cmUVProcessChain *)local_310);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290.WorkingDirectory._M_dataplus._M_p != &local_290.WorkingDirectory.field_2) {
      operator_delete(local_290.WorkingDirectory._M_dataplus._M_p,
                      local_290.WorkingDirectory.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
    ::~vector(&local_290.Processes);
    local_200.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = local_220;
    local_200.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = local_228;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_200);
  return local_200.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         local_200.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

bool cmCTest::RunMakeCommand(const std::string& command, std::string& output,
                             int* retVal, const char* dir, cmDuration timeout,
                             std::ostream& ofs, Encoding encoding)
{
  // First generate the command and arguments
  std::vector<std::string> args = cmSystemTools::ParseArguments(command);

  if (args.empty()) {
    return false;
  }

  output.clear();
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, "Run command:");
  for (auto const& arg : args) {
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, " \"" << arg << "\"");
  }
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, std::endl);

  // Now create process object
  cmUVProcessChainBuilder builder;
  builder.AddCommand(args).SetMergedBuiltinStreams();
  if (dir) {
    builder.SetWorkingDirectory(dir);
  }
  auto chain = builder.Start();
  cm::uv_pipe_ptr outputStream;
  outputStream.init(chain.GetLoop(), 0);
  uv_pipe_open(outputStream, chain.OutputStream());

  // Initialize tick's
  std::string::size_type tick = 0;
  std::string::size_type tick_len = 1024;
  std::string::size_type tick_line_len = 50;

  cmProcessOutput processOutput(encoding);
  cmCTestLog(this, HANDLER_PROGRESS_OUTPUT,
             "   Each . represents " << tick_len
                                     << " bytes of output\n"
                                        "    "
                                     << std::flush);
  auto outputHandle = cmUVStreamRead(
    outputStream,
    [this, &processOutput, &output, &tick, &tick_len, &tick_line_len,
     &ofs](std::vector<char> data) {
      std::string strdata;
      processOutput.DecodeText(data.data(), data.size(), strdata);
      for (char& cc : strdata) {
        if (cc == 0) {
          cc = '\n';
        }
      }
      output.append(strdata);
      while (output.size() > (tick * tick_len)) {
        tick++;
        cmCTestLog(this, HANDLER_PROGRESS_OUTPUT, "." << std::flush);
        if (tick % tick_line_len == 0 && tick > 0) {
          cmCTestLog(this, HANDLER_PROGRESS_OUTPUT,
                     "  Size: " << int((double(output.size()) / 1024.0) + 1)
                                << "K\n    " << std::flush);
        }
      }
      cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
                 cmCTestLogWrite(strdata.c_str(), strdata.size()));
      if (ofs) {
        ofs << cmCTestLogWrite(strdata.c_str(), strdata.size());
      }
    },
    [this, &processOutput, &output, &ofs]() {
      std::string strdata;
      processOutput.DecodeText(std::string(), strdata);
      if (!strdata.empty()) {
        output.append(strdata);
        cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
                   cmCTestLogWrite(strdata.c_str(), strdata.size()));
        if (ofs) {
          ofs << cmCTestLogWrite(strdata.c_str(), strdata.size());
        }
      }
    });

  bool finished = chain.Wait(static_cast<uint64_t>(timeout.count() * 1000.0));
  cmCTestLog(this, HANDLER_PROGRESS_OUTPUT,
             " Size of output: " << int(double(output.size()) / 1024.0) << "K"
                                 << std::endl);

  if (finished) {
    auto const& status = chain.GetStatus(0);
    auto exception = status.GetException();
    switch (exception.first) {
      case cmUVProcessChain::ExceptionCode::None:
        *retVal = static_cast<int>(status.ExitStatus);
        cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
                   "Command exited with the value: " << *retVal << std::endl);
        break;
      case cmUVProcessChain::ExceptionCode::Spawn:
        output += "\n*** ERROR executing: ";
        output += exception.second;
        output += "\n***The build process failed.";
        cmCTestLog(this, ERROR_MESSAGE,
                   "There was an error: " << exception.second << std::endl);
        break;
      default:
        *retVal = static_cast<int>(exception.first);
        cmCTestLog(this, WARNING,
                   "There was an exception: " << *retVal << std::endl);
        break;
    }
  } else {
    cmCTestLog(this, WARNING, "There was a timeout" << std::endl);
  }

  return true;
}